

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathContextPtr pxVar1;
  xmlXPathParserContextPtr ctxt_00;
  xmlChar *pxVar2;
  xmlXPathObjectPtr pxVar3;
  bool bVar4;
  xmlChar local_31;
  xmlBufPtr pxStack_30;
  xmlChar blank;
  xmlBufPtr target;
  xmlChar *source;
  xmlXPathObjectPtr obj;
  xmlXPathParserContextPtr pxStack_10;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  source = (xmlChar *)0x0;
  target = (xmlBufPtr)0x0;
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    obj._4_4_ = nargs;
    pxStack_10 = ctxt;
    if (nargs == 0) {
      pxVar1 = ctxt->context;
      pxVar2 = xmlXPathCastNodeToString(ctxt->context->node);
      pxVar3 = xmlXPathCacheWrapString(pxVar1,pxVar2);
      valuePush(ctxt,pxVar3);
      obj._4_4_ = 1;
    }
    if (pxStack_10 != (xmlXPathParserContextPtr)0x0) {
      if (obj._4_4_ == 1) {
        if (pxStack_10->valueNr < pxStack_10->valueFrame + 1) {
          xmlXPathErr(pxStack_10,0x17);
        }
        else {
          if ((pxStack_10->value != (xmlXPathObjectPtr)0x0) &&
             (pxStack_10->value->type != XPATH_STRING)) {
            xmlXPathStringFunction(pxStack_10,1);
          }
          if ((pxStack_10->value == (xmlXPathObjectPtr)0x0) ||
             (pxStack_10->value->type != XPATH_STRING)) {
            xmlXPathErr(pxStack_10,0xb);
          }
          else {
            source = (xmlChar *)valuePop(pxStack_10);
            target = (xmlBufPtr)((xmlXPathObjectPtr)source)->stringval;
            pxStack_30 = xmlBufCreate();
            if ((pxStack_30 != (xmlBufPtr)0x0) && (target != (xmlBufPtr)0x0)) {
              while( true ) {
                bVar4 = true;
                if ((*(char *)&target->content != ' ') &&
                   ((*(byte *)&target->content < 9 || (bVar4 = true, 10 < *(byte *)&target->content)
                    ))) {
                  bVar4 = *(char *)&target->content == '\r';
                }
                if (!bVar4) break;
                target = (xmlBufPtr)((long)&target->content + 1);
              }
              local_31 = '\0';
              for (; ctxt_00 = pxStack_10, *(char *)&target->content != '\0';
                  target = (xmlBufPtr)((long)&target->content + 1)) {
                if ((*(char *)&target->content == ' ') ||
                   (((8 < *(byte *)&target->content && (*(byte *)&target->content < 0xb)) ||
                    (*(char *)&target->content == '\r')))) {
                  local_31 = ' ';
                }
                else {
                  if (local_31 != '\0') {
                    xmlBufAdd(pxStack_30,&local_31,1);
                    local_31 = '\0';
                  }
                  xmlBufAdd(pxStack_30,(xmlChar *)target,1);
                }
              }
              pxVar1 = pxStack_10->context;
              pxVar2 = xmlBufContent(pxStack_30);
              pxVar3 = xmlXPathCacheNewString(pxVar1,pxVar2);
              valuePush(ctxt_00,pxVar3);
              xmlBufFree(pxStack_30);
            }
            xmlXPathReleaseObject(pxStack_10->context,(xmlXPathObjectPtr)source);
          }
        }
      }
      else {
        xmlXPathErr(pxStack_10,0xc);
      }
    }
  }
  return;
}

Assistant:

void
xmlXPathNormalizeFunction(xmlXPathParserContextPtr ctxt, int nargs) {
  xmlXPathObjectPtr obj = NULL;
  xmlChar *source = NULL;
  xmlBufPtr target;
  xmlChar blank;

  if (ctxt == NULL) return;
  if (nargs == 0) {
    /* Use current context node */
      valuePush(ctxt,
	  xmlXPathCacheWrapString(ctxt->context,
	    xmlXPathCastNodeToString(ctxt->context->node)));
    nargs = 1;
  }

  CHECK_ARITY(1);
  CAST_TO_STRING;
  CHECK_TYPE(XPATH_STRING);
  obj = valuePop(ctxt);
  source = obj->stringval;

  target = xmlBufCreate();
  if (target && source) {

    /* Skip leading whitespaces */
    while (IS_BLANK_CH(*source))
      source++;

    /* Collapse intermediate whitespaces, and skip trailing whitespaces */
    blank = 0;
    while (*source) {
      if (IS_BLANK_CH(*source)) {
	blank = 0x20;
      } else {
	if (blank) {
	  xmlBufAdd(target, &blank, 1);
	  blank = 0;
	}
	xmlBufAdd(target, source, 1);
      }
      source++;
    }
    valuePush(ctxt, xmlXPathCacheNewString(ctxt->context,
	xmlBufContent(target)));
    xmlBufFree(target);
  }
  xmlXPathReleaseObject(ctxt->context, obj);
}